

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O0

void leveldb::log::_Test_SkipIntoMultiRecord::_RunIt(void)

{
  undefined1 local_98 [8];
  _Test_SkipIntoMultiRecord t;
  
  _Test_SkipIntoMultiRecord((_Test_SkipIntoMultiRecord *)local_98);
  _Run((_Test_SkipIntoMultiRecord *)local_98);
  ~_Test_SkipIntoMultiRecord((_Test_SkipIntoMultiRecord *)local_98);
  return;
}

Assistant:

TEST(LogTest, SkipIntoMultiRecord) {
  // Consider a fragmented record:
  //    first(R1), middle(R1), last(R1), first(R2)
  // If initial_offset points to a record after first(R1) but before first(R2)
  // incomplete fragment errors are not actual errors, and must be suppressed
  // until a new first or full record is encountered.
  Write(BigString("foo", 3 * kBlockSize));
  Write("correct");
  StartReadingAt(kBlockSize);

  ASSERT_EQ("correct", Read());
  ASSERT_EQ("", ReportMessage());
  ASSERT_EQ(0, DroppedBytes());
  ASSERT_EQ("EOF", Read());
}